

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

int pr_cust(customer_t *c,int mode)

{
  undefined8 in_RDI;
  void *unaff_retaddr;
  undefined4 in_stack_00000008;
  int in_stack_000000b8;
  int in_stack_000000bc;
  int len;
  
  if (pr_cust::fp == (FILE *)0x0) {
    pr_cust::fp = print_prep(in_stack_000000bc,in_stack_000000b8);
  }
  dbg_print(c._4_4_,(FILE *)CONCAT44(mode,in_stack_00000008),unaff_retaddr,
            (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  len = (int)((ulong)in_RDI >> 0x20);
  if (scale < 0xbb9) {
    dbg_print(c._4_4_,(FILE *)CONCAT44(mode,in_stack_00000008),unaff_retaddr,len,(int)in_RDI);
  }
  else {
    dbg_print(c._4_4_,(FILE *)CONCAT44(mode,in_stack_00000008),unaff_retaddr,len,(int)in_RDI);
  }
  dbg_print(c._4_4_,(FILE *)CONCAT44(mode,in_stack_00000008),unaff_retaddr,
            (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  dbg_print(c._4_4_,(FILE *)CONCAT44(mode,in_stack_00000008),unaff_retaddr,
            (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  dbg_print(c._4_4_,(FILE *)CONCAT44(mode,in_stack_00000008),unaff_retaddr,
            (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  dbg_print(c._4_4_,(FILE *)CONCAT44(mode,in_stack_00000008),unaff_retaddr,
            (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  dbg_print(c._4_4_,(FILE *)CONCAT44(mode,in_stack_00000008),unaff_retaddr,
            (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  dbg_print(c._4_4_,(FILE *)CONCAT44(mode,in_stack_00000008),unaff_retaddr,
            (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  fprintf((FILE *)pr_cust::fp,"\n");
  return 0;
}

Assistant:

int
pr_cust(customer_t *c, int mode)
{
   static FILE *fp = NULL;
   UNUSED(mode);
        
   if (fp == NULL)
        fp = print_prep(CUST, 0);

   PR_STRT(fp);
   PR_HUGE(fp, &c->custkey);
   if (scale <= 3000)
   PR_VSTR(fp, c->name, C_NAME_LEN);
   else
   PR_VSTR(fp, c->name, C_NAME_LEN + 3);
   PR_VSTR(fp, c->address, c->alen);
   PR_HUGE(fp, &c->nation_code);
   PR_STR(fp, c->phone, PHONE_LEN);
   PR_MONEY(fp, &c->acctbal);
   PR_STR(fp, c->mktsegment, C_MSEG_LEN);
   PR_VSTR_LAST(fp, c->comment, c->clen);
   PR_END(fp);

   return(0);
}